

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

double __thiscall
imrt::ApertureILS::iLocalSearch(ApertureILS *this,Plan *P,double max_time,bool verbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  char *pcVar5;
  ostream *poVar6;
  clock_t cVar7;
  ulong uVar8;
  clock_t cVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  double dVar17;
  iterator s;
  double local_e8;
  double local_e0;
  int local_bc;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> a_list;
  double local_a0;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  
  pcVar5 = (char *)Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            (&stations,(list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)pcVar5);
  s._M_node = (_List_node_base *)0x0;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&diff;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node._M_size = 0;
  a_list.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  a_list.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  a_list.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = this->ls_type;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  local_e8 = Plan::getEvaluation(P);
  if (verbose) {
    pcVar5 = "Staring intensity local search...";
    poVar6 = std::operator<<((ostream *)&std::cout,"Staring intensity local search...");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  bVar4 = true;
  uVar15 = 0xffffffff;
  bVar10 = false;
  cVar7 = clock();
  local_bc = -1;
  iVar16 = -1;
  iVar11 = -1;
  do {
    if (!bVar4) break;
    getShuffledIntensityNeighbors
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &stack0xffffffffffffffb8,(ApertureILS *)pcVar5,P);
    iVar11 = iVar11 + 1;
    pcVar5 = (char *)&stack0xffffffffffffffb8;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_move_assign(&a_list)
    ;
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &stack0xffffffffffffffb8);
    if (verbose) {
      poVar6 = std::operator<<((ostream *)&std::cout,"  iLS Neighborhood ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar11);
      poVar6 = std::operator<<(poVar6," size ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      pcVar5 = "    current ";
      std::operator<<(poVar6,"    current ");
      poVar6 = std::ostream::_M_insert<double>(local_e8);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    uVar14 = 0;
    local_a0 = local_e8;
    bVar4 = false;
    bVar10 = false;
    while( true ) {
      uVar8 = (long)a_list.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)a_list.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      if (uVar8 <= uVar14) break;
      uVar2 = a_list.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar14].first;
      pcVar5 = (char *)(ulong)uVar2;
      if ((uVar2 == uVar15) &&
         (a_list.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar14].second == iVar16)) {
        bVar10 = (bool)(uVar14 == uVar8 - 1 | bVar10);
      }
      else {
        s._M_node = stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next;
        std::advance<std::_List_iterator<imrt::Station*>,int>(&s,uVar2);
        iVar13 = (int)uVar14;
        if (verbose) {
          poVar6 = std::operator<<((ostream *)&std::cout,"  iLS Neighbor ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar13);
          poVar6 = std::operator<<(poVar6," over station ");
          poVar6 = (ostream *)
                   std::ostream::operator<<(poVar6,*(int *)&(s._M_node[1]._M_next)->_M_prev);
          poVar6 = std::operator<<(poVar6," aperture ");
          iVar3 = a_list.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar14].second;
          iVar12 = -iVar3;
          if (0 < iVar3) {
            iVar12 = iVar3;
          }
          std::ostream::operator<<(poVar6,iVar12 + -1);
        }
        uVar2 = a_list.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar14].second;
        if ((int)uVar2 < 0) {
          Station::getModifyIntensityApertureDiff_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &stack0xffffffffffffffb8,(Station *)s._M_node[1]._M_next,~uVar2,
                     (double)-this->step_intensity);
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          _M_move_assign(&diff,(Station *)&stack0xffffffffffffffb8);
          std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
          ::_M_clear((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                     )&stack0xffffffffffffffb8);
          pcVar5 = (char *)s._M_node[1]._M_next;
          dVar17 = Plan::get_delta_eval(P,(Station *)pcVar5,&diff,999999);
          if (dVar17 <= local_e8) {
            iVar3 = a_list.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].second;
            iVar12 = -iVar3;
            if (0 < iVar3) {
              iVar12 = iVar3;
            }
            Station::modifyIntensityAperture_abi_cxx11_
                      ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &stack0xffffffffffffffb8,(Station *)s._M_node[1]._M_next,iVar12 + -1,
                       (double)-this->step_intensity);
            pcVar5 = (char *)&stack0xffffffffffffffb8;
            std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&diff);
            std::__cxx11::
            _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_clear
                      ((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        *)&stack0xffffffffffffffb8);
            local_e0 = local_e8;
            if (diff.
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                _M_impl._M_node._M_size != 0) {
              pcVar5 = (char *)s._M_node[1]._M_next;
              local_e0 = Plan::incremental_eval(P,(Station *)pcVar5,&diff);
            }
          }
          else {
            Station::clearHistory((Station *)s._M_node[1]._M_next);
            local_e0 = local_e8;
          }
          if (verbose) {
            poVar6 = std::operator<<((ostream *)&std::cout," (-");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->step_intensity);
            std::operator<<(poVar6,")");
            goto LAB_00125051;
          }
LAB_001250bb:
          if (1e-05 < local_a0 - local_e0) {
LAB_001250d1:
            iVar16 = -a_list.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar14].second;
            uVar15 = a_list.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar14].first;
            local_bc = iVar13;
            if (iVar1 == 0) {
              bVar10 = (bool)(((long)a_list.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)a_list.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U == uVar14
                             | bVar10);
              bVar4 = true;
              local_e8 = local_e0;
              goto LAB_00125287;
            }
            bVar4 = true;
            local_a0 = local_e0;
          }
        }
        else {
          Station::getModifyIntensityApertureDiff_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &stack0xffffffffffffffb8,(Station *)s._M_node[1]._M_next,uVar2 - 1,
                     (double)this->step_intensity);
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          _M_move_assign(&diff,(Station *)&stack0xffffffffffffffb8);
          std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
          ::_M_clear((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                     )&stack0xffffffffffffffb8);
          pcVar5 = (char *)s._M_node[1]._M_next;
          dVar17 = Plan::get_delta_eval(P,(Station *)pcVar5,&diff,999999);
          if (dVar17 <= local_e8) {
            Station::modifyIntensityAperture_abi_cxx11_
                      ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &stack0xffffffffffffffb8,(Station *)s._M_node[1]._M_next,
                       a_list.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar14].second + -1,
                       (double)this->step_intensity);
            pcVar5 = (char *)&stack0xffffffffffffffb8;
            std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            _M_move_assign(&diff);
            std::__cxx11::
            _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_clear
                      ((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        *)&stack0xffffffffffffffb8);
            local_e0 = local_e8;
            if (diff.
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                _M_impl._M_node._M_size != 0) {
              pcVar5 = (char *)s._M_node[1]._M_next;
              local_e0 = Plan::incremental_eval(P,(Station *)pcVar5,&diff);
            }
          }
          else {
            Station::clearHistory((Station *)s._M_node[1]._M_next);
            local_e0 = local_e8;
          }
          if (!verbose) goto LAB_001250bb;
          poVar6 = std::operator<<((ostream *)&std::cout," (+");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->step_intensity);
          std::operator<<(poVar6,")");
LAB_00125051:
          std::operator<<((ostream *)&std::cout," result ");
          poVar6 = std::ostream::_M_insert<double>(local_e0);
          std::endl<char,std::char_traits<char>>(poVar6);
          if (1e-05 < local_a0 - local_e0) {
            pcVar5 = "     improvement ";
            std::operator<<((ostream *)&std::cout,"     improvement ");
            poVar6 = std::ostream::_M_insert<double>(local_e0);
            std::endl<char,std::char_traits<char>>(poVar6);
            goto LAB_001250d1;
          }
        }
        Station::undoLast_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &stack0xffffffffffffffb8,(Station *)s._M_node[1]._M_next);
        pcVar5 = (char *)&stack0xffffffffffffffb8;
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        _M_move_assign(&diff);
        std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        _M_clear((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 &stack0xffffffffffffffb8);
        if (diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl._M_node._M_size != 0) {
          pcVar5 = (char *)s._M_node[1]._M_next;
          Plan::incremental_eval(P,(Station *)pcVar5,&diff);
        }
        bVar10 = (bool)(uVar14 == ((long)a_list.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)a_list.
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U |
                       bVar10);
        cVar9 = clock();
        if (((max_time != 0.0) || (NAN(max_time))) &&
           (max_time <= (double)(cVar9 - cVar7) / 1000000.0)) break;
      }
      uVar14 = uVar14 + 1;
    }
    local_e8 = local_a0;
    if ((bool)(iVar1 != 0 & bVar4)) {
      uVar2 = a_list.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start[local_bc].second;
      if ((int)uVar2 < 0) {
        Station::modifyIntensityAperture_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &stack0xffffffffffffffb8,(Station *)s._M_node[1]._M_next,~uVar2,
                   (double)-this->step_intensity);
      }
      else {
        Station::modifyIntensityAperture_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &stack0xffffffffffffffb8,(Station *)s._M_node[1]._M_next,uVar2 - 1,
                   (double)this->step_intensity);
      }
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_move_assign(&diff,(Station *)&stack0xffffffffffffffb8);
      std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_clear((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               &stack0xffffffffffffffb8);
      pcVar5 = (char *)s._M_node[1]._M_next;
      Plan::incremental_eval(P,(Station *)pcVar5,&diff);
    }
LAB_00125287:
    cVar9 = clock();
  } while (((max_time == 0.0) && (!NAN(max_time))) ||
          ((double)(cVar9 - cVar7) / 1000000.0 < max_time));
  std::operator<<((ostream *)&std::cout,"  iLS best: ");
  std::ostream::_M_insert<double>(local_e8);
  pcVar5 = ": [nolo] : ";
  if (bVar10) {
    pcVar5 = ": [lo] : ";
  }
  std::operator<<((ostream *)&std::cout,pcVar5);
  cVar9 = clock();
  poVar6 = std::ostream::_M_insert<double>(max_time);
  std::operator<<(poVar6," :");
  poVar6 = std::ostream::_M_insert<double>((double)(cVar9 - cVar7) / 1000000.0);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&a_list.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
  ;
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
  ;
  std::__cxx11::_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>::_M_clear
            (&stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>);
  return local_e8;
}

Assistant:

double ApertureILS::iLocalSearch (Plan& P,  double max_time, bool verbose) {
    list<Station*> stations = P.get_stations();
    list<Station*>::iterator s;
    
    std::clock_t time_end, time_begin;
    double used_time; 
    
    double local_best_eval, current_eval, aux_eval;
    list<pair<int, double> > diff;
    vector<pair<int, int>> a_list;
    pair <int,int> tabu;
    
    bool improvement = true;
    bool best_improvement=ls_type;
    bool completed = false;
    int i, j, best_n;
    
    tabu = make_pair(-1,-1);
    best_n = -1;
    j=-1;
    local_best_eval = current_eval = aux_eval = P.getEvaluation();
    
    if (verbose)
      cout << "Staring intensity local search..." << endl;
    time_begin=clock();
    
    // Main local search loop
    while (improvement) {
      improvement = false;
      completed = false;
      j++;
      current_eval = local_best_eval;
      a_list = getShuffledIntensityNeighbors(P);

      if (verbose) {
        cout << "  iLS Neighborhood "<< j << " size "<< a_list.size() << "    current " << local_best_eval << endl;
      }
      
      // Check all the neighbors
      for (i = 0; i < a_list.size(); i++) {
         //skip the tabu neighbor (returns the station to previous state)
         if (a_list[i].first == tabu.first && a_list[i].second == tabu.second) {
           if (i == (a_list.size()-1)) completed = true;
           continue;
         }
         //get the station of the movement
         s = stations.begin();
         std::advance(s, a_list[i].first);
         
         if (verbose)
             cout << "  iLS Neighbor " << i << " over station " << (*s)->getAngle() << " aperture " <<  abs(a_list[i].second)-1;
         
         aux_eval = current_eval;
         
         //apply step_size intensity change (-(a+1) or +(a+1))
         if (a_list[i].second < 0 ){
           diff = (*s)->getModifyIntensityApertureDiff(abs(a_list[i].second)-1, -step_intensity);
           if (P.get_delta_eval((*(*s)), diff) > current_eval) {
             (*s)->clearHistory();
           } else {
             diff = (*s)->modifyIntensityAperture(abs(a_list[i].second)-1, -step_intensity);
             if (diff.size() > 0) {
               aux_eval = P.incremental_eval(*(*s), diff);
             }
           }
           if (verbose)
             cout << " (-" << step_intensity << ")";
         } else {
           diff = (*s)->getModifyIntensityApertureDiff(a_list[i].second-1, step_intensity);
           if (P.get_delta_eval((*(*s)), diff) > current_eval) {
             (*s)->clearHistory();
           } else {
             diff = (*s)->modifyIntensityAperture(a_list[i].second-1, step_intensity);
             if (diff.size() > 0) {
               aux_eval = P.incremental_eval(*(*s), diff);
             }
           }
           if (verbose)
             cout << " (+"<< step_intensity << ")";
         }
         
         if (verbose )
             cout << " result " << aux_eval <<endl;
         // First improvement
         if ((local_best_eval - aux_eval) > 0.00001){
           local_best_eval = aux_eval;
           best_n = i;
           improvement = true;
           if (verbose)
             cout << "     improvement " << aux_eval << endl ;
           
           
           // Add a tabu movement since we found improvement
           tabu.first = a_list[i].first;
           tabu.second = -1*a_list[i].second;
           
           // If first improvement has been chosen break and 
           if (!best_improvement) { 
             if (i==(a_list.size()-1)) completed = true;
             break;
           }
         }
         
         // Undo movement to continue the search
         diff = (*s)->undoLast();
         if (diff.size()>0)
           aux_eval = P.incremental_eval(*(*s), diff);
         
         if (i == (a_list.size()-1)) completed = true;
         
         time_end = clock();
         used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
         if (max_time!=0 && used_time >= max_time) {
           break;
         }
       } 
      
       //Apply best neighbor
       if (improvement && best_improvement) {
         if (a_list[best_n].second < 0 ){
           diff = (*s)->modifyIntensityAperture(abs(a_list[best_n].second)-1, -step_intensity);
           aux_eval = P.incremental_eval(*(*s), diff);
         } else {
           diff = (*s)->modifyIntensityAperture(a_list[best_n].second-1, step_intensity);
           aux_eval = P.incremental_eval(*(*s), diff);
         }
       }
       
       time_end = clock();
       used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
       if (max_time!=0 && used_time >= max_time) {
         break;
       }
    }
    
    cout << "  iLS best: " << local_best_eval ;
    if (!completed) cout << ": [nolo] : ";
    else  cout << ": [lo] : ";
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    cout << max_time << " :" << used_time << endl;
    return(local_best_eval);
}